

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  long lVar1;
  oggpack_buffer *poVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  oggpack_buffer *apoStack_50 [2];
  ulong local_40;
  long local_38;
  
  apoStack_50[1] = b;
  if (0 < book->used_entries) {
    lVar7 = book->dim;
    uVar3 = (uint)((long)n / lVar7);
    lVar8 = -((long)(int)uVar3 * 8 + 0xfU & 0xfffffffffffffff0);
    lVar1 = lVar8 + -0x48;
    iVar6 = point - book->binarypoint;
    local_38 = (long)n / lVar7;
    bVar5 = (byte)iVar6;
    if (iVar6 < 0) {
      if (0 < (int)uVar3) {
        local_40 = (ulong)(uVar3 & 0x7fffffff);
        uVar9 = 0;
        do {
          poVar2 = apoStack_50[1];
          *(undefined8 *)((long)apoStack_50 + lVar8) = 0x12054a;
          lVar4 = decode_packed_entry_number(book,poVar2);
          if (lVar4 == -1) {
            return -1;
          }
          lVar7 = book->dim;
          *(ogg_int32_t **)((long)apoStack_50 + uVar9 * 8 + lVar1 + 0x50) =
               book->valuelist + lVar4 * lVar7;
          uVar9 = uVar9 + 1;
        } while (local_40 != uVar9);
      }
      if (0 < lVar7) {
        uVar3 = (uint)local_38;
        lVar8 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar9 = 0;
            do {
              a[uVar9] = a[uVar9] +
                         (*(int *)(*(long *)((long)apoStack_50 + uVar9 * 8 + lVar1 + 0x50) +
                                  lVar8 * 4) << (-bVar5 & 0x1f));
              uVar9 = uVar9 + 1;
            } while ((uVar3 & 0x7fffffff) != uVar9);
          }
          lVar8 = lVar8 + 1;
          a = a + (int)uVar3;
        } while (lVar8 != lVar7);
        return 0;
      }
    }
    else {
      if (0 < (int)uVar3) {
        local_40 = (ulong)(uVar3 & 0x7fffffff);
        uVar9 = 0;
        do {
          poVar2 = apoStack_50[1];
          *(undefined8 *)((long)apoStack_50 + lVar8) = 0x1204b1;
          lVar4 = decode_packed_entry_number(book,poVar2);
          if (lVar4 == -1) {
            return -1;
          }
          lVar7 = book->dim;
          *(ogg_int32_t **)((long)apoStack_50 + uVar9 * 8 + lVar1 + 0x50) =
               book->valuelist + lVar4 * lVar7;
          uVar9 = uVar9 + 1;
        } while (local_40 != uVar9);
      }
      if (0 < lVar7) {
        uVar3 = (uint)local_38;
        lVar8 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar9 = 0;
            do {
              a[uVar9] = a[uVar9] +
                         (*(int *)(*(long *)((long)apoStack_50 + uVar9 * 8 + lVar1 + 0x50) +
                                  lVar8 * 4) >> (bVar5 & 0x1f));
              uVar9 = uVar9 + 1;
            } while ((uVar3 & 0x7fffffff) != uVar9);
          }
          lVar8 = lVar8 + 1;
          a = a + (int)uVar3;
        } while (lVar8 != lVar7);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,
			      oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){  
    int step=n/book->dim;
    long *entry = (long *)alloca(sizeof(*entry)*step);
    ogg_int32_t **t = (ogg_int32_t **)alloca(sizeof(*t)*step);
    int i,j,o;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]>>shift;
    }else{
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]<<-shift;
    }
  }
  return(0);
}